

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_optimize_for.pb.cc
# Opt level: O0

void proto2_unittest::TestOptimizedForSize::SharedDtor(MessageLite *self)

{
  ForeignMessage *this;
  bool bVar1;
  Arena *pAVar2;
  LogMessage *pLVar3;
  LogMessage local_30;
  Voidify local_19;
  TestOptimizedForSize *local_18;
  TestOptimizedForSize *this_;
  MessageLite *self_local;
  
  local_18 = (TestOptimizedForSize *)self;
  this_ = (TestOptimizedForSize *)self;
  google::protobuf::internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            (&self->_internal_metadata_);
  pAVar2 = google::protobuf::MessageLite::GetArena((MessageLite *)local_18);
  if (pAVar2 != (Arena *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_optimize_for.pb.cc"
               ,0x11a,"this_.GetArena() == nullptr");
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar3);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_30);
  }
  this = *(ForeignMessage **)((long)&local_18->field_0 + 0x20);
  if (this != (ForeignMessage *)0x0) {
    proto2_unittest::ForeignMessage::~ForeignMessage(this);
    operator_delete(this,0x20);
  }
  bVar1 = has_foo(local_18);
  if (bVar1) {
    clear_foo(local_18);
  }
  Impl_::~Impl_(&(local_18->field_0)._impl_);
  return;
}

Assistant:

inline void TestOptimizedForSize::SharedDtor(MessageLite& self) {
  TestOptimizedForSize& this_ = static_cast<TestOptimizedForSize&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.msg_;
  if (this_.has_foo()) {
    this_.clear_foo();
  }
  this_._impl_.~Impl_();
}